

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

array * json::array::parse(Pig *pig)

{
  bool bVar1;
  size_type sVar2;
  array *paVar3;
  string *psVar4;
  allocator<char> local_51;
  value *value;
  string local_48;
  
  sVar2 = Pig::cursor(pig);
  Pig::skipWS(pig);
  bVar1 = Pig::skip(pig,0x5b);
  if (bVar1) {
    Pig::skipWS(pig);
    paVar3 = (array *)operator_new(0x20);
    (paVar3->super_value)._vptr_value = (_func_int **)&PTR__array_00187bd8;
    (paVar3->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (paVar3->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (paVar3->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value = json::value::parse(pig);
    if (value != (value *)0x0) {
      std::vector<json::value_*,_std::allocator<json::value_*>_>::push_back(&paVar3->_data,&value);
      value = (value *)0x0;
      while( true ) {
        Pig::skipWS(pig);
        bVar1 = Pig::skip(pig,0x2c);
        if (!bVar1) break;
        Pig::skipWS(pig);
        value = json::value::parse(pig);
        if (value == (value *)0x0) {
          (*(paVar3->super_value)._vptr_value[1])(paVar3);
          psVar4 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,"Error: missing value after \',\' at position {1}",
                     &local_51);
          sVar2 = Pig::cursor(pig);
          format<int>(psVar4,&local_48,(int)sVar2);
          __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::vector<json::value_*,_std::allocator<json::value_*>_>::push_back(&paVar3->_data,&value)
        ;
      }
    }
    bVar1 = Pig::skip(pig,0x5d);
    if (!bVar1) {
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Error: missing \']\' at position {1}",&local_51);
      sVar2 = Pig::cursor(pig);
      format<int>(psVar4,&local_48,(int)sVar2);
      __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  else {
    Pig::restoreTo(pig,sVar2);
    paVar3 = (array *)0x0;
  }
  return paVar3;
}

Assistant:

json::array* json::array::parse (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  pig.skipWS ();
  if (pig.skip ('['))
  {
    pig.skipWS ();

    auto arr = new json::array ();

    json::value* value;
    if ((value = json::value::parse (pig)))
    {
      arr->_data.push_back (value);
      value = nullptr; // Not a leak.  Looks like a leak.
      pig.skipWS ();
      while (pig.skip (','))
      {
        pig.skipWS ();

        if ((value = json::value::parse (pig)))
        {
          arr->_data.push_back (value);
          pig.skipWS ();
        }
        else
        {
          delete arr;
          throw format ("Error: missing value after ',' at position {1}", (int) pig.cursor ());
        }
      }
    }

    if (pig.skip (']'))
      return arr;
    else
      throw format ("Error: missing ']' at position {1}", (int) pig.cursor ());

    delete arr;
  }

  pig.restoreTo (checkpoint);
  return nullptr;
}